

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O0

int Cnf_CutSuperAreaFlow(Vec_Ptr_t *vSuper,int *pAreaFlows)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint local_38;
  int local_28;
  int local_24;
  int nAreaFlow;
  int i;
  Aig_Obj_t *pLeaf;
  int *pAreaFlows_local;
  Vec_Ptr_t *vSuper_local;
  
  iVar1 = Vec_PtrSize(vSuper);
  local_28 = (iVar1 + 1) * 100;
  local_24 = 0;
  do {
    iVar1 = Vec_PtrSize(vSuper);
    if (iVar1 <= local_24) {
      return local_28;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vSuper,local_24);
    pAVar2 = Aig_Regular(pAVar2);
    iVar1 = Aig_ObjIsNode(pAVar2);
    if (iVar1 != 0) {
      if ((*(ulong *)&pAVar2->field_0x18 >> 6 & 0x3ffffff) == 0) {
        __assert_fail("pLeaf->nRefs > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/cnf/cnfMap.c"
                      ,0x53,"int Cnf_CutSuperAreaFlow(Vec_Ptr_t *, int *)");
      }
      if ((*(ulong *)&pAVar2->field_0x18 >> 6 & 0x3ffffff) == 0) {
        local_38 = 1;
      }
      else {
        local_38 = (uint)(*(ulong *)&pAVar2->field_0x18 >> 6) & 0x3ffffff;
      }
      local_28 = pAreaFlows[pAVar2->Id] / (int)local_38 + local_28;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

int Cnf_CutSuperAreaFlow( Vec_Ptr_t * vSuper, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i, nAreaFlow;
    nAreaFlow = 100 * (Vec_PtrSize(vSuper) + 1);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pLeaf, i )
    {
        pLeaf = Aig_Regular(pLeaf);
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        nAreaFlow += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
    return nAreaFlow;
}